

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconinter.c
# Opt level: O3

void av1_setup_dst_planes
               (macroblockd_plane *planes,BLOCK_SIZE bsize,YV12_BUFFER_CONFIG *src,int mi_row,
               int mi_col,int plane_start,int plane_end)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint8_t *puVar4;
  int iVar5;
  int y;
  uint uVar6;
  int *piVar7;
  long lVar8;
  int x;
  uint uVar9;
  ulong uVar10;
  
  iVar5 = 3;
  if (plane_end < 3) {
    iVar5 = plane_end;
  }
  if (plane_start < iVar5) {
    lVar8 = (long)plane_start;
    piVar7 = &planes[lVar8].dst.stride;
    do {
      uVar10 = (ulong)(0 < lVar8);
      puVar4 = src->store_buf_adr[lVar8 + -4];
      uVar6 = (uint)((0x20005UL >> ((ulong)bsize & 0x3f) & 1) != 0);
      if (piVar7[-8] == 0) {
        uVar6 = 0;
      }
      uVar9 = (uint)((0x10003UL >> ((ulong)bsize & 0x3f) & 1) != 0);
      if (piVar7[-9] == 0) {
        uVar9 = 0;
      }
      iVar1 = *(int *)((long)src->store_buf_adr + uVar10 * 4 + -0x28);
      iVar2 = *(int *)((long)src->store_buf_adr + uVar10 * 4 + -0x38);
      iVar3 = *(int *)((long)src->store_buf_adr + uVar10 * 4 + -0x30);
      ((buf_2d *)(piVar7 + -6))->buf =
           puVar4 + (long)((int)((~uVar6 & mi_row) << 2) >> ((byte)piVar7[-8] & 0x1f)) * (long)iVar1
                    + (long)((int)((~uVar9 & mi_col) << 2) >> ((byte)piVar7[-9] & 0x1f));
      *(uint8_t **)(piVar7 + -4) = puVar4;
      piVar7[-2] = iVar2;
      piVar7[-1] = iVar3;
      *piVar7 = iVar1;
      lVar8 = lVar8 + 1;
      piVar7 = piVar7 + 0x28c;
    } while (iVar5 != lVar8);
  }
  return;
}

Assistant:

void av1_setup_dst_planes(struct macroblockd_plane *planes, BLOCK_SIZE bsize,
                          const YV12_BUFFER_CONFIG *src, int mi_row, int mi_col,
                          const int plane_start, const int plane_end) {
  // We use AOMMIN(num_planes, MAX_MB_PLANE) instead of num_planes to quiet
  // the static analysis warnings.
  for (int i = plane_start; i < AOMMIN(plane_end, MAX_MB_PLANE); ++i) {
    struct macroblockd_plane *const pd = &planes[i];
    const int is_uv = i > 0;
    setup_pred_plane(&pd->dst, bsize, src->buffers[i], src->crop_widths[is_uv],
                     src->crop_heights[is_uv], src->strides[is_uv], mi_row,
                     mi_col, NULL, pd->subsampling_x, pd->subsampling_y);
  }
}